

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<short,long>(BaseAppender *this,Vector *col,short input)

{
  long lVar1;
  
  lVar1 = Cast::Operation<short,long>(input);
  *(long *)(col->data + (this->chunk).count * 8) = lVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}